

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTests(Config *config)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  TextAttributes *this;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  pointer this_00;
  TestCaseInfo *this_01;
  long *in_RDI;
  Colour colourGuard;
  Code colour;
  TestCaseInfo *testCaseInfo;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TextAttributes tagsAttr;
  TextAttributes nameAttr;
  size_t matchedTests;
  TestSpec testSpec;
  undefined4 in_stack_fffffffffffffc78;
  Code in_stack_fffffffffffffc7c;
  TestSpecParser *in_stack_fffffffffffffc80;
  size_t sVar5;
  TestSpecParser *in_stack_fffffffffffffc88;
  ostream *in_stack_fffffffffffffc90;
  Text *in_stack_fffffffffffffc98;
  ostream *in_stack_fffffffffffffca0;
  string *in_stack_fffffffffffffca8;
  allocator *paVar6;
  TestSpecParser *in_stack_fffffffffffffcb0;
  allocator local_2b9;
  string local_2b8 [79];
  allocator local_269;
  string local_268 [136];
  TextAttributes *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  Text *in_stack_fffffffffffffe30;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_148;
  undefined1 local_140 [24];
  TextAttributes local_128;
  TextAttributes local_108;
  size_t local_e8;
  allocator local_d9;
  string local_d8 [184];
  undefined1 local_20 [24];
  long *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RDI + 0x68))();
  TestSpec::TestSpec((TestSpec *)in_stack_fffffffffffffc80,
                     (TestSpec *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  (**(code **)(*local_8 + 0x68))();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x257268);
  if (bVar1) {
    poVar3 = cout();
    std::operator<<(poVar3,"Matching test cases:\n");
  }
  else {
    poVar3 = cout();
    std::operator<<(poVar3,"All available test cases:\n");
    ITagAliasRegistry::get();
    TestSpecParser::TestSpecParser
              (in_stack_fffffffffffffc80,
               (ITagAliasRegistry *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"*",&local_d9);
    TestSpecParser::parse(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    TestSpecParser::testSpec(in_stack_fffffffffffffc88);
    TestSpec::operator=((TestSpec *)in_stack_fffffffffffffc80,
                        (TestSpec *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    TestSpec::~TestSpec((TestSpec *)0x25736a);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    TestSpecParser::~TestSpecParser(in_stack_fffffffffffffc80);
  }
  local_e8 = 0;
  Tbc::TextAttributes::TextAttributes(&local_108);
  Tbc::TextAttributes::TextAttributes(&local_128);
  this = Tbc::TextAttributes::setInitialIndent(&local_108,2);
  Tbc::TextAttributes::setIndent(this,4);
  Tbc::TextAttributes::setIndent(&local_128,6);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)0x257460);
  pIVar4 = getRegistryHub();
  iVar2 = (*pIVar4->_vptr_IRegistryHub[3])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
            ((long *)CONCAT44(extraout_var,iVar2),local_20,local_8,local_140,0);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffc80,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
             CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  __gnu_cxx::
  __normal_iterator<Catch::TestCase_const*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>
  ::__normal_iterator<Catch::TestCase*>
            ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)in_stack_fffffffffffffc80,
             (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffc80,
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)), bVar1
        ) {
    local_e8 = local_e8 + 1;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
              ::operator->(&local_148);
    this_01 = TestCase::getTestCaseInfo(this_00);
    TestCaseInfo::isHidden(this_01);
    Colour::Colour((Colour *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c);
    cout();
    Tbc::Text::Text(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    poVar3 = Tbc::operator<<(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Tbc::Text::~Text((Text *)in_stack_fffffffffffffc80);
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x257611);
    if (!bVar1) {
      cout();
      Tbc::Text::Text(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20)
      ;
      poVar3 = Tbc::operator<<(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Tbc::Text::~Text((Text *)in_stack_fffffffffffffc80);
    }
    Colour::~Colour((Colour *)0x257706);
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_148);
  }
  (**(code **)(*local_8 + 0x68))();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x25774c);
  if (bVar1) {
    cout();
    paVar6 = &local_2b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"matching test case",paVar6);
    pluralise::pluralise
              ((pluralise *)in_stack_fffffffffffffc80,
               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),(string *)0x2578fa);
    in_stack_fffffffffffffc90 =
         operator<<((ostream *)in_stack_fffffffffffffc80,
                    (pluralise *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    poVar3 = std::operator<<(in_stack_fffffffffffffc90,"\n");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise((pluralise *)0x25794d);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  }
  else {
    cout();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"test case",&local_269);
    pluralise::pluralise
              ((pluralise *)in_stack_fffffffffffffc80,
               CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),(string *)0x2577be);
    poVar3 = operator<<((ostream *)in_stack_fffffffffffffc80,
                        (pluralise *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
    poVar3 = std::operator<<(poVar3,"\n");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise((pluralise *)0x257811);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
  }
  sVar5 = local_e8;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_stack_fffffffffffffc90)
  ;
  TestSpec::~TestSpec((TestSpec *)0x2579f9);
  return sVar5;
}

Assistant:

inline std::size_t listTests( Config const& config ) {

        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Matching test cases:\n";
        else {
            Catch::cout() << "All available test cases:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::size_t matchedTests = 0;
        TextAttributes nameAttr, tagsAttr;
        nameAttr.setInitialIndent( 2 ).setIndent( 4 );
        tagsAttr.setIndent( 6 );

        std::vector<TestCase> matchedTestCases;
        getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, config, matchedTestCases );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Colour::Code colour = testCaseInfo.isHidden()
                ? Colour::SecondaryText
                : Colour::None;
            Colour colourGuard( colour );

            Catch::cout() << Text( testCaseInfo.name, nameAttr ) << std::endl;
            if( !testCaseInfo.tags.empty() )
                Catch::cout() << Text( testCaseInfo.tagsAsString, tagsAttr ) << std::endl;
        }

        if( !config.testSpec().hasFilters() )
            Catch::cout() << pluralise( matchedTests, "test case" ) << "\n" << std::endl;
        else
            Catch::cout() << pluralise( matchedTests, "matching test case" ) << "\n" << std::endl;
        return matchedTests;
    }